

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O1

ConstPixelBufferAccess *
vkt::image::anon_unknown_0::getLayerOrSlice
          (ConstPixelBufferAccess *__return_storage_ptr__,Texture *texture,
          ConstPixelBufferAccess *access,int layer)

{
  ImageType IVar1;
  
  IVar1 = texture->m_type;
  if (IVar1 < IMAGE_TYPE_LAST) {
    if ((0x78U >> (IVar1 & 0x1f) & 1) == 0) {
      if ((0x85U >> (IVar1 & 0x1f) & 1) == 0) {
        tcu::getSubregion(__return_storage_ptr__,access,0,layer,(access->m_size).m_data[0],1);
      }
      else {
        __return_storage_ptr__->m_format = access->m_format;
        (__return_storage_ptr__->m_size).m_data[2] = (access->m_size).m_data[2];
        *(undefined8 *)(__return_storage_ptr__->m_size).m_data =
             *(undefined8 *)(access->m_size).m_data;
        *(undefined8 *)(__return_storage_ptr__->m_pitch).m_data =
             *(undefined8 *)(access->m_pitch).m_data;
        (__return_storage_ptr__->m_pitch).m_data[2] = (access->m_pitch).m_data[2];
        __return_storage_ptr__->m_data = access->m_data;
      }
    }
    else {
      tcu::getSubregion(__return_storage_ptr__,access,0,0,layer,(access->m_size).m_data[0],
                        (access->m_size).m_data[1],1);
    }
  }
  else {
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::ConstPixelBufferAccess getLayerOrSlice (const Texture& texture, const tcu::ConstPixelBufferAccess access, const int layer)
{
	switch (texture.type())
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_2D:
		case IMAGE_TYPE_BUFFER:
			// Not layered
			DE_ASSERT(layer == 0);
			return access;

		case IMAGE_TYPE_1D_ARRAY:
			return tcu::getSubregion(access, 0, layer, access.getWidth(), 1);

		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
		case IMAGE_TYPE_3D:			// 3d texture is treated as if depth was the layers
			return tcu::getSubregion(access, 0, 0, layer, access.getWidth(), access.getHeight(), 1);

		default:
			DE_FATAL("Internal test error");
			return tcu::ConstPixelBufferAccess();
	}
}